

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

int cmd_filelength(char *args)

{
  size_t sVar1;
  long lVar2;
  undefined8 uVar3;
  ulong uVar4;
  PHYSFS_sint64 len;
  PHYSFS_File *f;
  char *args_local;
  
  f = (PHYSFS_File *)args;
  if (*args == '\"') {
    f = (PHYSFS_File *)(args + 1);
    sVar1 = strlen((char *)f);
    *(char *)((long)f + (sVar1 - 1)) = '\0';
  }
  lVar2 = PHYSFS_openRead(f);
  if (lVar2 == 0) {
    uVar3 = PHYSFS_getLastError();
    printf("failed to open. Reason: [%s].\n",uVar3);
  }
  else {
    uVar4 = PHYSFS_fileLength(lVar2);
    if (uVar4 == 0xffffffffffffffff) {
      uVar3 = PHYSFS_getLastError();
      printf("failed to determine length. Reason: [%s].\n",uVar3);
    }
    else {
      printf(" (cast to int) %d bytes.\n",uVar4 & 0xffffffff);
    }
    PHYSFS_close(lVar2);
  }
  return 1;
}

Assistant:

static int cmd_filelength(char *args)
{
    PHYSFS_File *f;

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    f = PHYSFS_openRead(args);
    if (f == NULL)
        printf("failed to open. Reason: [%s].\n", PHYSFS_getLastError());
    else
    {
        PHYSFS_sint64 len = PHYSFS_fileLength(f);
        if (len == -1)
            printf("failed to determine length. Reason: [%s].\n", PHYSFS_getLastError());
        else
            printf(" (cast to int) %d bytes.\n", (int) len);

        PHYSFS_close(f);
    } /* else */

    return 1;
}